

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O0

context_t * ZmqContextManager::getContext(string *contextName)

{
  context_t *pcVar1;
  string *in_stack_00000038;
  
  getContextPointer(in_stack_00000038);
  std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4e0db5);
  pcVar1 = getBaseContext((ZmqContextManager *)0x4e0dbd);
  std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x4e0dce);
  return pcVar1;
}

Assistant:

zmq::context_t& ZmqContextManager::getContext(const std::string& contextName)
{
    return getContextPointer(contextName)->getBaseContext();
}